

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O2

fdb_status
wal_dur_snapshot_open
          (fdb_seqnum_t seqnum,_fdb_key_cmp_info *key_cmp_info,filemgr *file,fdb_txn *txn,
          snap_handle **shandle)

{
  snap_handle *shandle_00;
  fdb_status fVar1;
  fdb_kvs_id_t kv_id;
  
  if (seqnum == 0xffffffffffffffff) {
    fdb_assert_die("seqnum != FDB_SNAPSHOT_INMEM",
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/wal.cc"
                   ,0x739,0xffffffffffffffff,(uint64_t)key_cmp_info->kvs);
  }
  if (key_cmp_info->kvs == (kvs_info *)0x0) {
    kv_id = 0;
  }
  else {
    kv_id = key_cmp_info->kvs->id;
  }
  fVar1 = FDB_RESULT_SUCCESS;
  shandle_00 = _wal_snapshot_create(kv_id,0,0);
  if (shandle_00 == (snap_handle *)0x0) {
    fVar1 = FDB_RESULT_ALLOC_FAIL;
  }
  else {
    pthread_spin_lock(&file->wal->lock);
    _wal_snapshot_init(shandle_00,file,txn,seqnum,key_cmp_info);
    pthread_spin_unlock(&file->wal->lock);
    *shandle = shandle_00;
  }
  return fVar1;
}

Assistant:

fdb_status wal_dur_snapshot_open(fdb_seqnum_t seqnum,
                                 _fdb_key_cmp_info *key_cmp_info,
                                 struct filemgr *file, fdb_txn *txn,
                                 struct snap_handle **shandle)
{
    struct snap_handle *_shandle;
    fdb_kvs_id_t kv_id;
    fdb_assert(seqnum != FDB_SNAPSHOT_INMEM, seqnum, key_cmp_info->kvs);
    if (!key_cmp_info->kvs) {
        kv_id = 0;
    } else {
        kv_id = key_cmp_info->kvs->id;
    }
    _shandle = _wal_snapshot_create(kv_id, 0, 0);
    if (!_shandle) { // LCOV_EXCL_START
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP
    spin_lock(&file->wal->lock);
    _wal_snapshot_init(_shandle, file, txn, seqnum, key_cmp_info);
    spin_unlock(&file->wal->lock);
    *shandle = _shandle;
    return FDB_RESULT_SUCCESS;
}